

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  UdpSocketTest *this;
  TcpSocketTest *this_00;
  UdpSocketTest *local_78;
  TestCase *test_set [10];
  TestRunner local_19;
  char **ppcStack_18;
  TestRunner runner;
  char **argv_local;
  int argc_local;
  
  ppcStack_18 = argv;
  TestRunner::TestRunner(&local_19,*argv);
  this = (UdpSocketTest *)
         operator_new(0x130,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
                      ,0x13e);
  UdpSocketTest::UdpSocketTest(this);
  local_78 = this;
  this_00 = (TcpSocketTest *)
            operator_new(0x138,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
                         ,0x13f);
  TcpSocketTest::TcpSocketTest(this_00);
  test_set[0] = (TestCase *)this_00;
  TestRunner::RunAll(&local_19,(TestCase **)&local_78,2);
  return 0;
}

Assistant:

int main( int argc, char*argv[] )
{	
	TestRunner runner( argv[ 0 ] );

	TestCase *test_set[ 10 ];
	
	test_set[ 0 ] = jh_new UdpSocketTest();
	test_set[ 1 ] = jh_new TcpSocketTest();
	
	runner.RunAll( test_set, 2 );

	return 0;
}